

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O2

void __thiscall ft::deque<int,_ft::allocator<int>_>::clear(deque<int,_ft::allocator<int>_> *this)

{
  ulong uVar1;
  ulong uVar2;
  dequeIterator<int,_64UL> local_78;
  dequeIterator<int,_64UL> local_50;
  
  uVar1 = this->m_size;
  uVar2 = uVar1;
  while (uVar1 >> 1 < uVar2) {
    pop_back(this);
    uVar2 = uVar2 - 1;
    uVar1 = this->m_size;
  }
  while( true ) {
    dequeIterator<int,_64UL>::dequeIterator(&local_78,&this->m_start);
    dequeIterator<int,_64UL>::dequeIterator(&local_50,&this->m_finish);
    if (local_78.m_cur == local_50.m_cur) break;
    pop_front(this);
  }
  return;
}

Assistant:

void clear() {
		size_type n = this->size();
		while (n > this->size() / 2) {
			this->pop_back();
			--n;
		}

		while (this->begin() != this->end())
			this->pop_front();
	}